

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_prot.c
# Opt level: O2

_Bool xdr_naccepted_reply(XDR *xdrs,accepted_reply *ar)

{
  u_int *ip;
  xdr_op xVar1;
  uint uVar2;
  _Bool _Var3;
  bool_t bVar4;
  char *pcVar5;
  char *pcVar6;
  undefined8 uStack_30;
  
  if (xdrs == (XDR *)0x0) {
    pcVar5 = "xdrs != NULL";
    uVar2 = 0x4e;
LAB_0010ea48:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_c_cmakelists/linuxbox2[P]ntirpc/src/rpc_prot.c"
                  ,uVar2,"_Bool xdr_naccepted_reply(XDR *, struct accepted_reply *)");
  }
  if (ar == (accepted_reply *)0x0) {
    pcVar5 = "ar != NULL";
    uVar2 = 0x4f;
    goto LAB_0010ea48;
  }
  xVar1 = xdrs->x_op;
  if (xVar1 == XDR_FREE) goto LAB_0010e9ac;
  if (xVar1 == XDR_DECODE) {
    _Var3 = xdr_getuint32(xdrs,(uint32_t *)&ar->ar_verf);
    if (!_Var3) {
      if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
        return false;
      }
      pcVar5 = "%s:%u ERROR oa_flavor";
      pcVar6 = "xdr_opaque_auth_decode";
      uStack_30 = 0x87;
      goto LAB_0010e980;
    }
    ip = &(ar->ar_verf).oa_length;
    _Var3 = xdr_getuint32(xdrs,ip);
    if (!_Var3) {
      if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
        return false;
      }
      pcVar5 = "%s:%u ERROR oa_length";
      pcVar6 = "xdr_opaque_auth_decode";
      uStack_30 = 0x8c;
      goto LAB_0010e980;
    }
    uVar2 = *ip;
    if (uVar2 == 0) goto LAB_0010e9ac;
    if (400 < uVar2) {
      if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
        return false;
      }
      pcVar5 = "xdr_opaque_auth_decode_it";
      uStack_30 = 0x70;
LAB_0010e8a8:
      (*__ntirpc_pkg_params.warnx_)
                ("%s:%u ERROR oa_length (%u) > %u",pcVar5,uStack_30,(ulong)uVar2,400);
      return false;
    }
    _Var3 = xdr_opaque_decode(xdrs,(ar->ar_verf).oa_body,uVar2);
LAB_0010e9a8:
    if (_Var3 == false) {
      return false;
    }
LAB_0010e9ac:
    bVar4 = xdr_enum((XDR *)xdrs,(enum_t *)ar);
    if ((char)bVar4 != '\0') {
      if (ar->ar_stat != PROG_MISMATCH) {
        if (ar->ar_stat == SUCCESS) {
          _Var3 = (*(ar->ru).AR_results.proc)(xdrs,(ar->ru).AR_results.where);
          return _Var3;
        }
        return true;
      }
      _Var3 = xdr_u_int32_t(xdrs,(u_int32_t *)&ar->ru);
      if (_Var3) {
        _Var3 = xdr_u_int32_t(xdrs,&(ar->ru).AR_versions.high);
        return _Var3;
      }
    }
    return false;
  }
  if (xVar1 != XDR_ENCODE) {
    if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
      return false;
    }
    (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR xdrs->x_op (%u)","xdr_opaque_auth",0xa7);
    return false;
  }
  _Var3 = xdr_putenum(xdrs,(ar->ar_verf).oa_flavor);
  if (_Var3) {
    _Var3 = xdr_putuint32(xdrs,(ar->ar_verf).oa_length);
    if (_Var3) {
      uVar2 = (ar->ar_verf).oa_length;
      if (uVar2 == 0) goto LAB_0010e9ac;
      if (400 < uVar2) {
        if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
          return false;
        }
        pcVar5 = "xdr_opaque_auth_encode_it";
        uStack_30 = 0x3f;
        goto LAB_0010e8a8;
      }
      _Var3 = xdr_opaque_encode(xdrs,(ar->ar_verf).oa_body,uVar2);
      goto LAB_0010e9a8;
    }
    if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
      return false;
    }
    pcVar5 = "%s:%u ERROR oa_length";
    uStack_30 = 0x5b;
  }
  else {
    if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
      return false;
    }
    pcVar5 = "%s:%u ERROR oa_flavor";
    uStack_30 = 0x55;
  }
  pcVar6 = "xdr_opaque_auth_encode";
LAB_0010e980:
  (*__ntirpc_pkg_params.warnx_)(pcVar5,pcVar6,uStack_30);
  return false;
}

Assistant:

bool
xdr_naccepted_reply(XDR *xdrs, struct accepted_reply *ar)
{
	assert(xdrs != NULL);
	assert(ar != NULL);

	/* personalized union, rather than calling xdr_union */
	if (!xdr_opaque_auth(xdrs, &(ar->ar_verf)))
		return (false);
	if (!inline_xdr_enum(xdrs, (enum_t *) &(ar->ar_stat)))
		return (false);
	switch (ar->ar_stat) {

	case SUCCESS:
		return ((*(ar->ar_results.proc)) (xdrs, ar->ar_results.where));

	case PROG_MISMATCH:
		if (!inline_xdr_u_int32_t(xdrs, &(ar->ar_vers.low)))
			return (false);
		return (inline_xdr_u_int32_t(xdrs, &(ar->ar_vers.high)));

	case GARBAGE_ARGS:
	case SYSTEM_ERR:
	case PROC_UNAVAIL:
	case PROG_UNAVAIL:
		break;
	}
	return (true);		/* true => open ended set of problems */
}